

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O1

fsg_arciter_t * fsg_model_arcs(fsg_model_t *fsg,int32 i)

{
  hash_table_t *phVar1;
  fsg_arciter_t *pfVar2;
  hash_iter_t *phVar3;
  
  if ((fsg->trans[i].trans == (hash_table_t *)0x0) &&
     (fsg->trans[i].null_trans == (hash_table_t *)0x0)) {
    pfVar2 = (fsg_arciter_t *)0x0;
  }
  else {
    pfVar2 = (fsg_arciter_t *)
             __ckd_calloc__(1,0x18,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                            ,0x122);
    phVar1 = fsg->trans[i].null_trans;
    if (phVar1 != (hash_table_t *)0x0) {
      phVar3 = hash_table_iter(phVar1);
      pfVar2->null_itor = phVar3;
    }
    phVar1 = fsg->trans[i].trans;
    if (phVar1 != (hash_table_t *)0x0) {
      phVar3 = hash_table_iter(phVar1);
      pfVar2->itor = phVar3;
    }
    if (pfVar2->itor != (hash_iter_t *)0x0) {
      pfVar2->gn = (gnode_t *)pfVar2->itor->ent->val;
    }
  }
  return pfVar2;
}

Assistant:

fsg_arciter_t *
fsg_model_arcs(fsg_model_t * fsg, int32 i)
{
    fsg_arciter_t *itor;

    if (fsg->trans[i].trans == NULL && fsg->trans[i].null_trans == NULL)
        return NULL;
    itor = ckd_calloc(1, sizeof(*itor));
    if (fsg->trans[i].null_trans)
        itor->null_itor = hash_table_iter(fsg->trans[i].null_trans);
    if (fsg->trans[i].trans)
        itor->itor = hash_table_iter(fsg->trans[i].trans);
    if (itor->itor != NULL)
        itor->gn = hash_entry_val(itor->itor->ent);
    return itor;
}